

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O3

int mbedtls_gcm_self_test(int verbose)

{
  uchar (*input) [64];
  size_t length;
  size_t iv_len;
  size_t add_len;
  int iVar1;
  int iVar2;
  int iVar3;
  uchar (*pauVar4) [16];
  uchar (*pauVar5) [64];
  uchar (*input_00) [64];
  uchar (*key) [32];
  uchar (*iv) [64];
  long lVar6;
  uint keybits;
  ulong uVar7;
  long lVar8;
  uchar (*add) [64];
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int local_2a0;
  ulong local_298;
  uchar (*local_280) [16];
  uchar tag_buf [16];
  uchar buf [64];
  mbedtls_gcm_context ctx;
  
  pauVar4 = tag_test_data;
  pauVar5 = ct_test_data;
  lVar8 = 0;
  do {
    uVar7 = lVar8 * 0x40 + 0x80;
    lVar9 = 0;
    lVar6 = 0;
    local_298 = 0;
    input_00 = pauVar5;
    local_280 = pauVar4;
    do {
      memset(&ctx,0,0x1a8);
      keybits = (uint)uVar7;
      if (verbose != 0) {
        printf("  AES-GCM-%3d #%d (%s): ",uVar7 & 0xffffffff,local_298,"enc");
      }
      key = key_test_data + *(int *)((long)key_index_test_data + lVar6);
      iVar1 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if (iVar1 == -0x72 && uVar7 == 0xc0) {
        puts("skipped");
        break;
      }
      if (iVar1 != 0) {
LAB_0012d2f1:
        local_2a0 = iVar1;
        if (verbose != 0) {
          puts("failed");
        }
        mbedtls_cipher_free(&ctx.cipher_ctx);
        mbedtls_platform_zeroize(&ctx,0x1a8);
        return local_2a0;
      }
      length = *(size_t *)((long)pt_len_test_data + lVar9);
      iv = iv_test_data + *(int *)((long)iv_index_test_data + lVar6);
      iv_len = *(size_t *)((long)iv_len_test_data + lVar9);
      add = additional_test_data + *(int *)((long)add_index_test_data + lVar6);
      add_len = *(size_t *)((long)add_len_test_data + lVar9);
      iVar3 = *(int *)((long)key_index_test_data + lVar6);
      input = pt_test_data + iVar3;
      iVar1 = mbedtls_gcm_crypt_and_tag
                        (&ctx,1,length,*iv,iv_len,*add,add_len,*input,buf,0x10,tag_buf);
      if (iVar1 != 0) goto LAB_0012d2f1;
      iVar1 = bcmp(buf,input_00,length);
      if ((iVar1 != 0) ||
         (auVar10[0] = -((*local_280)[0] == tag_buf[0]),
         auVar10[1] = -((*local_280)[1] == tag_buf[1]),
         auVar10[2] = -((*local_280)[2] == tag_buf[2]),
         auVar10[3] = -((*local_280)[3] == tag_buf[3]),
         auVar10[4] = -((*local_280)[4] == tag_buf[4]),
         auVar10[5] = -((*local_280)[5] == tag_buf[5]),
         auVar10[6] = -((*local_280)[6] == tag_buf[6]),
         auVar10[7] = -((*local_280)[7] == tag_buf[7]),
         auVar10[8] = -((*local_280)[8] == tag_buf[8]),
         auVar10[9] = -((*local_280)[9] == tag_buf[9]),
         auVar10[10] = -((*local_280)[10] == tag_buf[10]),
         auVar10[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
         auVar10[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
         auVar10[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
         auVar10[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
         auVar10[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff)) {
        local_2a0 = 1;
        iVar1 = local_2a0;
        goto LAB_0012d2f1;
      }
      local_2a0 = 1;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      mbedtls_platform_zeroize(&ctx,0x1a8);
      if (verbose == 0) {
        memset(&ctx,0,0x1a8);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a8);
        printf("  AES-GCM-%3d #%d (%s): ",uVar7 & 0xffffffff,local_298,"dec");
      }
      iVar1 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if (iVar1 != 0) goto LAB_0012d2f1;
      iVar1 = mbedtls_gcm_crypt_and_tag
                        (&ctx,0,length,*iv,iv_len,*add,add_len,*input_00,buf,0x10,tag_buf);
      if (((iVar1 != 0) || (iVar2 = bcmp(buf,input,length), iVar1 = local_2a0, iVar2 != 0)) ||
         (auVar11[0] = -((*local_280)[0] == tag_buf[0]),
         auVar11[1] = -((*local_280)[1] == tag_buf[1]),
         auVar11[2] = -((*local_280)[2] == tag_buf[2]),
         auVar11[3] = -((*local_280)[3] == tag_buf[3]),
         auVar11[4] = -((*local_280)[4] == tag_buf[4]),
         auVar11[5] = -((*local_280)[5] == tag_buf[5]),
         auVar11[6] = -((*local_280)[6] == tag_buf[6]),
         auVar11[7] = -((*local_280)[7] == tag_buf[7]),
         auVar11[8] = -((*local_280)[8] == tag_buf[8]),
         auVar11[9] = -((*local_280)[9] == tag_buf[9]),
         auVar11[10] = -((*local_280)[10] == tag_buf[10]),
         auVar11[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
         auVar11[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
         auVar11[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
         auVar11[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
         auVar11[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar11[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_0012d2f1;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      mbedtls_platform_zeroize(&ctx,0x1a8);
      if (verbose == 0) {
        memset(&ctx,0,0x1a8);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a8);
        printf("  AES-GCM-%3d #%d split (%s): ",uVar7 & 0xffffffff,local_298,"enc");
      }
      iVar1 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if ((iVar1 != 0) || (iVar1 = mbedtls_gcm_starts(&ctx,1,*iv,iv_len,*add,add_len), iVar1 != 0))
      goto LAB_0012d2f1;
      if (local_298 < 2) {
        iVar1 = mbedtls_gcm_update(&ctx,length,*input,buf);
      }
      else {
        iVar1 = mbedtls_gcm_update(&ctx,0x20,*input,buf);
        if (iVar1 != 0) goto LAB_0012d2f1;
        iVar1 = mbedtls_gcm_update(&ctx,length - 0x20,pt_test_data[iVar3] + 0x20,buf + 0x20);
      }
      if (iVar1 != 0) goto LAB_0012d2f1;
      iVar1 = mbedtls_gcm_finish(&ctx,tag_buf,0x10);
      if (((iVar1 != 0) || (iVar3 = bcmp(buf,input_00,length), iVar1 = local_2a0, iVar3 != 0)) ||
         (auVar12[0] = -((*local_280)[0] == tag_buf[0]),
         auVar12[1] = -((*local_280)[1] == tag_buf[1]),
         auVar12[2] = -((*local_280)[2] == tag_buf[2]),
         auVar12[3] = -((*local_280)[3] == tag_buf[3]),
         auVar12[4] = -((*local_280)[4] == tag_buf[4]),
         auVar12[5] = -((*local_280)[5] == tag_buf[5]),
         auVar12[6] = -((*local_280)[6] == tag_buf[6]),
         auVar12[7] = -((*local_280)[7] == tag_buf[7]),
         auVar12[8] = -((*local_280)[8] == tag_buf[8]),
         auVar12[9] = -((*local_280)[9] == tag_buf[9]),
         auVar12[10] = -((*local_280)[10] == tag_buf[10]),
         auVar12[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
         auVar12[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
         auVar12[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
         auVar12[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
         auVar12[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar12[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_0012d2f1;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      mbedtls_platform_zeroize(&ctx,0x1a8);
      if (verbose == 0) {
        memset(&ctx,0,0x1a8);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a8);
        printf("  AES-GCM-%3d #%d split (%s): ",uVar7 & 0xffffffff,local_298,"dec");
      }
      iVar1 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if ((iVar1 != 0) || (iVar1 = mbedtls_gcm_starts(&ctx,0,*iv,iv_len,*add,add_len), iVar1 != 0))
      goto LAB_0012d2f1;
      if (local_298 < 2) {
        iVar1 = mbedtls_gcm_update(&ctx,length,*input_00,buf);
      }
      else {
        iVar1 = mbedtls_gcm_update(&ctx,0x20,*input_00,buf);
        if (iVar1 != 0) goto LAB_0012d2f1;
        iVar1 = mbedtls_gcm_update(&ctx,length - 0x20,*input_00 + 0x20,buf + 0x20);
      }
      if ((((iVar1 != 0) || (iVar1 = mbedtls_gcm_finish(&ctx,tag_buf,0x10), iVar1 != 0)) ||
          (iVar3 = bcmp(buf,input,length), iVar1 = local_2a0, iVar3 != 0)) ||
         (auVar13[0] = -((*local_280)[0] == tag_buf[0]),
         auVar13[1] = -((*local_280)[1] == tag_buf[1]),
         auVar13[2] = -((*local_280)[2] == tag_buf[2]),
         auVar13[3] = -((*local_280)[3] == tag_buf[3]),
         auVar13[4] = -((*local_280)[4] == tag_buf[4]),
         auVar13[5] = -((*local_280)[5] == tag_buf[5]),
         auVar13[6] = -((*local_280)[6] == tag_buf[6]),
         auVar13[7] = -((*local_280)[7] == tag_buf[7]),
         auVar13[8] = -((*local_280)[8] == tag_buf[8]),
         auVar13[9] = -((*local_280)[9] == tag_buf[9]),
         auVar13[10] = -((*local_280)[10] == tag_buf[10]),
         auVar13[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
         auVar13[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
         auVar13[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
         auVar13[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
         auVar13[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar13[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_0012d2f1;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      mbedtls_platform_zeroize(&ctx,0x1a8);
      if (verbose != 0) {
        puts("passed");
      }
      local_298 = local_298 + 1;
      local_280 = local_280 + 1;
      input_00 = input_00 + 1;
      lVar6 = lVar6 + 4;
      lVar9 = lVar9 + 8;
    } while (lVar6 != 0x18);
    lVar8 = lVar8 + 1;
    pauVar4 = pauVar4 + 6;
    pauVar5 = pauVar5 + 6;
    if (lVar8 == 3) {
      if (verbose != 0) {
        putchar(10);
      }
      return 0;
    }
  } while( true );
}

Assistant:

int mbedtls_gcm_self_test( int verbose )
{
    mbedtls_gcm_context ctx;
    unsigned char buf[64];
    unsigned char tag_buf[16];
    int i, j, ret;
    mbedtls_cipher_id_t cipher = MBEDTLS_CIPHER_ID_AES;

    for( j = 0; j < 3; j++ )
    {
        int key_len = 128 + 64 * j;

        for( i = 0; i < MAX_TESTS; i++ )
        {
            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                key_len, i, "enc" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            /*
             * AES-192 is an optional feature that may be unavailable when
             * there is an alternative underlying implementation i.e. when
             * MBEDTLS_AES_ALT is defined.
             */
            if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && key_len == 192 )
            {
                mbedtls_printf( "skipped\n" );
                break;
            }
            else if( ret != 0 )
            {
                goto exit;
            }

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_ENCRYPT,
                                pt_len_test_data[i],
                                iv_test_data[iv_index_test_data[i]],
                                iv_len_test_data[i],
                                additional_test_data[add_index_test_data[i]],
                                add_len_test_data[i],
                                pt_test_data[pt_index_test_data[i]],
                                buf, 16, tag_buf );
            if( ret != 0 )
                goto exit;

            if ( memcmp( buf, ct_test_data[j * 6 + i],
                         pt_len_test_data[i] ) != 0 ||
                 memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                key_len, i, "dec" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_DECRYPT,
                                pt_len_test_data[i],
                                iv_test_data[iv_index_test_data[i]],
                                iv_len_test_data[i],
                                additional_test_data[add_index_test_data[i]],
                                add_len_test_data[i],
                                ct_test_data[j * 6 + i], buf, 16, tag_buf );

            if( ret != 0 )
                goto exit;

            if( memcmp( buf, pt_test_data[pt_index_test_data[i]],
                        pt_len_test_data[i] ) != 0 ||
                memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                key_len, i, "enc" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_ENCRYPT,
                                  iv_test_data[iv_index_test_data[i]],
                                  iv_len_test_data[i],
                                  additional_test_data[add_index_test_data[i]],
                                  add_len_test_data[i] );
            if( ret != 0 )
                goto exit;

            if( pt_len_test_data[i] > 32 )
            {
                size_t rest_len = pt_len_test_data[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32,
                                          pt_test_data[pt_index_test_data[i]],
                                          buf );
                if( ret != 0 )
                    goto exit;

                ret = mbedtls_gcm_update( &ctx, rest_len,
                                      pt_test_data[pt_index_test_data[i]] + 32,
                                      buf + 32 );
                if( ret != 0 )
                    goto exit;
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len_test_data[i],
                                          pt_test_data[pt_index_test_data[i]],
                                          buf );
                if( ret != 0 )
                    goto exit;
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 )
                goto exit;

            if( memcmp( buf, ct_test_data[j * 6 + i],
                        pt_len_test_data[i] ) != 0 ||
                memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                key_len, i, "dec" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_DECRYPT,
                              iv_test_data[iv_index_test_data[i]],
                              iv_len_test_data[i],
                              additional_test_data[add_index_test_data[i]],
                              add_len_test_data[i] );
            if( ret != 0 )
                goto exit;

            if( pt_len_test_data[i] > 32 )
            {
                size_t rest_len = pt_len_test_data[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, ct_test_data[j * 6 + i],
                                          buf );
                if( ret != 0 )
                    goto exit;

                ret = mbedtls_gcm_update( &ctx, rest_len,
                                          ct_test_data[j * 6 + i] + 32,
                                          buf + 32 );
                if( ret != 0 )
                    goto exit;
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len_test_data[i],
                                          ct_test_data[j * 6 + i],
                                          buf );
                if( ret != 0 )
                    goto exit;
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 )
                goto exit;

            if( memcmp( buf, pt_test_data[pt_index_test_data[i]],
                        pt_len_test_data[i] ) != 0 ||
                memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    ret = 0;

exit:
    if( ret != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );
        mbedtls_gcm_free( &ctx );
    }

    return( ret );
}